

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.h
# Opt level: O0

void __thiscall
InstructionRegVmFinalizeContext::InstructionRegVmFinalizeContext
          (InstructionRegVmFinalizeContext *this,ExpressionContext *ctx,Allocator *allocator)

{
  Allocator *allocator_local;
  ExpressionContext *ctx_local;
  InstructionRegVmFinalizeContext *this_local;
  
  this->ctx = ctx;
  FastVector<SynBase_*,_false,_false>::FastVector(&this->locations);
  FastVector<RegVmCmd,_false,_false>::FastVector(&this->cmds);
  FastVector<unsigned_int,_false,_false>::FastVector(&this->constants);
  FastVector<unsigned_char,_false,_false>::FastVector(&this->regKillInfo);
  SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::SmallArray
            (&this->fixupPoints,allocator);
  this->currentFunction = (VmFunction *)0x0;
  this->currentBlock = (VmBlock *)0x0;
  return;
}

Assistant:

InstructionRegVmFinalizeContext(ExpressionContext &ctx, Allocator *allocator): ctx(ctx), fixupPoints(allocator)
	{
		currentFunction = 0;
		currentBlock = 0;
	}